

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suprun.c
# Opt level: O1

void supivoc1(supcxdef *sup,voccxdef *ctx,vocidef *v,objnum target,int inh_from_obj,int flags)

{
  ushort uVar1;
  uint uVar2;
  vocidef *v_00;
  errcxdef *ec;
  mcmcxdef *mctx;
  objnum oVar3;
  int iVar4;
  size_t sVar5;
  vocdef **ppvVar6;
  uint uVar7;
  vocdef *pvVar8;
  uchar *wrd2;
  objnum *poVar9;
  uint *puVar10;
  char buf [40];
  
  uVar7 = (uint)v->vocinsc;
  if (v->vocinsc != 0) {
    poVar9 = (v->vociu).vocius.vociussc;
    do {
      uVar1 = *poVar9;
      v_00 = ctx->voccxinh[uVar1 >> 8][(byte)uVar1];
      if (v_00 == (vocidef *)0x0) {
        supgnam(buf,sup->supcxtab,uVar1);
        ec = ctx->voccxerr;
        mctx = ctx->voccxmem;
        sVar5 = strlen(buf);
        sup_log_undefobj(mctx,ec,0x40d,buf,(int)sVar5,*poVar9);
      }
      else {
        supivoc1(sup,ctx,v_00,target,0,flags);
        if ((((v_00->vociu).vocius.vociusflg & 1) != 0) && ((v->vociu).vocius.vociusilc == 0xffff))
        {
          oVar3 = (v_00->vociu).vocius.vociusloc;
          if (oVar3 == 0xffff) {
            oVar3 = (v_00->vociu).vocius.vociusilc;
          }
          (v->vociu).vocius.vociusilc = oVar3;
        }
        if (((inh_from_obj != 0) || (((v_00->vociu).vocius.vociusflg & 1) != 0)) &&
           (((v_00->vociu).vocius.vociusflg & 2) != 0)) {
          uVar1 = *poVar9;
          iVar4 = 0x100;
          ppvVar6 = ctx->voccxhsh;
          do {
            for (pvVar8 = *ppvVar6; pvVar8 != (vocdef *)0x0; pvVar8 = pvVar8->vocnxt) {
              uVar2 = pvVar8->vocwlst;
              if (uVar2 == 0xffffffff) {
                puVar10 = (uint *)0x0;
              }
              else {
                puVar10 = (uint *)((long)&ctx->voccxwp[(ulong)uVar2 / 2000]->vocwnxt +
                                  (ulong)(uVar2 % 2000 << 3));
              }
              if (puVar10 != (uint *)0x0) {
                do {
                  if ((ushort)puVar10[1] == uVar1) {
                    wrd2 = (uchar *)0x0;
                    if (pvVar8->vocln2 != 0) {
                      wrd2 = pvVar8->voctxt + pvVar8->voclen;
                    }
                    vocadd2(ctx,(ushort)*(byte *)((long)puVar10 + 6),target,flags + 2,pvVar8->voctxt
                            ,(uint)pvVar8->voclen,wrd2,(uint)pvVar8->vocln2);
                  }
                  uVar2 = *puVar10;
                  if (uVar2 == 0xffffffff) {
                    puVar10 = (uint *)0x0;
                  }
                  else {
                    puVar10 = (uint *)((long)&ctx->voccxwp[(ulong)uVar2 / 2000]->vocwnxt +
                                      (ulong)(uVar2 % 2000 << 3));
                  }
                } while (puVar10 != (uint *)0x0);
              }
            }
            ppvVar6 = ppvVar6 + 1;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
      }
      poVar9 = poVar9 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

void supivoc1(supcxdef *sup, voccxdef *ctx, vocidef *v, objnum target,
              int inh_from_obj, int flags)
{
    objnum   *sc;
    int       numsc;
    vocidef  *scv;
    
    for (numsc = v->vocinsc, sc = v->vocisc ; numsc ; ++sc, --numsc)
    {
        scv = vocinh(ctx, *sc);
        if (scv)
        {
            /* inherit from its superclasses first */
            supivoc1(sup, ctx, scv, target, FALSE, flags);
            
            /* if it's a class object, we can inherit from it */
            if (scv->vociflg & VOCIFCLASS)
            {
                /* inherit location, if we haven't already done so */
                if (v->vociilc == MCMONINV)
                {
                    if (scv->vociloc == MCMONINV)
                        v->vociilc = scv->vociilc;
                    else
                        v->vociilc = scv->vociloc;
                }
            }

            /*
             *   inherit from superclass if it's a class, or if we're
             *   supposed to inherit from any object 
             */
            if (inh_from_obj || (scv->vociflg & VOCIFCLASS))
            {
                /* inherit vocabulary if this superclass has any words */
                if (scv->vociflg & VOCIFVOC)
                    supiwrds(ctx, *sc, target, flags);
            }
        }
        else
        {
            char  buf[TOKNAMMAX + 1];

            /* get the symbol's name */
            supgnam(buf, sup->supcxtab, *sc);

            /* log an error with the symbol's name and location of first use */
            sup_log_undefobj(ctx->voccxmem, ctx->voccxerr, ERR_UNDFOBJ,
                             buf, (int)strlen(buf), *sc);
        }
    }    
}